

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.cpp
# Opt level: O0

uint64 __thiscall crnlib::data_stream::skip(data_stream *this,uint64 len)

{
  uint uVar1;
  unsigned_long_long uVar2;
  ulong uVar3;
  unsigned_long_long in_RSI;
  long *in_RDI;
  uint64 bytes_read;
  uint64 bytes_to_read;
  uint8 buf [1024];
  uint cBufSize;
  uint64 total_bytes_read;
  undefined1 local_428 [1036];
  undefined4 local_1c;
  uint64 local_18;
  unsigned_long_long local_10;
  
  local_18 = 0;
  local_1c = 0x400;
  local_10 = in_RSI;
  while( true ) {
    if (local_10 == 0) {
      return local_18;
    }
    uVar2 = math::minimum<unsigned_long_long>(0x400,local_10);
    uVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,local_428,uVar2 & 0xffffffff);
    uVar3 = (ulong)uVar1;
    local_18 = uVar3 + local_18;
    if (uVar3 != uVar2) break;
    local_10 = local_10 - uVar3;
  }
  return local_18;
}

Assistant:

uint64 data_stream::skip(uint64 len) {
  uint64 total_bytes_read = 0;

  const uint cBufSize = 1024;
  uint8 buf[cBufSize];

  while (len) {
    const uint64 bytes_to_read = math::minimum<uint64>(sizeof(buf), len);
    const uint64 bytes_read = read(buf, static_cast<uint>(bytes_to_read));
    total_bytes_read += bytes_read;

    if (bytes_read != bytes_to_read)
      break;

    len -= bytes_read;
  }

  return total_bytes_read;
}